

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  IdealDiffuseBxDF *pIVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  BxDFFlags BVar9;
  uint64_t sequenceIndex;
  uint64_t seed;
  Tuple3<pbrt::Vector3,_float> *wi_00;
  int s;
  uint uVar10;
  Tuple3<pbrt::Vector3,_float> *wo_00;
  pbrt *this_00;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this_01;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  Float FVar14;
  Float FVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar26 [12];
  undefined1 auVar25 [16];
  undefined1 in_ZMM5 [64];
  Vector3<float> args_1;
  Vector3<float> args;
  Vector3f wo_01;
  Vector3f wi_01;
  float local_15c;
  Point2f u;
  anon_class_8_1_ba1d750b r;
  uint uStack_144;
  undefined4 uStack_140;
  uint uStack_13c;
  Tuple3<pbrt::Vector3,_float> local_128;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> rInterface;
  Tuple3<pbrt::Vector3,_float> local_108;
  undefined1 local_f8 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_e8;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  BSDFSample wos;
  BSDFSample wis;
  RNG rng;
  undefined1 extraout_var [60];
  
  auVar26 = in_ZMM5._4_12_;
  local_108.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._8_56_ = wi._8_56_;
  auVar24._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c0.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._8_56_ = wo._8_56_;
  auVar20._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11 = auVar20._0_16_;
  local_c0._0_8_ = vmovlps_avx(auVar11);
  local_f8 = auVar24._0_16_;
  local_108._0_8_ = vmovlps_avx(local_f8);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided == '\0') || (0.0 <= local_c0.z)) {
    uStack_140 = 0;
    uStack_144 = in_XMM3_Db;
    uStack_13c = in_XMM3_Dd;
  }
  else {
    local_f8._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
    local_f8._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    local_f8._12_4_ = wi._12_4_ ^ 0x80000000;
    auVar11._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
    auVar11._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar11._12_4_ = wo._12_4_ ^ 0x80000000;
    local_c0.z = -local_c0.z;
    local_108.z = -local_108.z;
    uStack_144 = in_XMM3_Db ^ 0x80000000;
    uStack_13c = in_XMM3_Dd ^ 0x80000000;
    local_c0._0_8_ = vmovlps_avx(auVar11);
    local_108._0_8_ = vmovlps_avx(local_f8);
    uStack_140 = 0x80000000;
  }
  fVar8 = local_c0.z;
  fVar12 = local_108.z;
  this_00 = (pbrt *)(ulong)*(uint *)(Options + 4);
  args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  args_1.super_Tuple3<pbrt::Vector3,_float>.z = local_c0.z;
  sequenceIndex = Hash<int,pbrt::Vector3<float>>(*(uint *)(Options + 4),args_1);
  auVar11 = local_f8;
  args.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
  args.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_f8._0_4_;
  args.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_f8._4_4_;
  local_f8 = auVar11;
  seed = Hash<pbrt::Vector3<float>>(this_00,args);
  RNG::SetSequence(&rng,sequenceIndex,seed);
  auVar11 = local_f8;
  auVar4._4_4_ = uStack_144;
  auVar4._0_4_ = fVar12;
  auVar4._8_4_ = uStack_140;
  auVar4._12_4_ = uStack_13c;
  local_15c = 0.0;
  r.rng = &rng;
  if (0.0 < fVar12 * fVar8) {
    auVar25._0_4_ = (float)(this->config).nSamples;
    auVar25._4_12_ = auVar26;
    if (fVar8 <= 0.0) {
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar11 = vandps_avx512vl(auVar4,auVar3);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)(auVar11._0_4_ * 0.31830987)),auVar25,
                                ZEXT816(0) << 0x40);
      local_15c = auVar11._0_4_;
    }
    else {
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar8;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_f8._0_4_;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_f8._4_4_;
      local_f8 = auVar11;
      auVar21._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_01,wi_01,mode,Reflection);
      auVar21._4_60_ = extraout_var;
      auVar11 = vfmadd213ss_fma(auVar21._0_16_,ZEXT416((uint)auVar25._0_4_),ZEXT416(0));
      local_15c = auVar11._0_4_;
    }
  }
  pIVar1 = &this->bottom;
  uVar10 = 0;
  do {
    bVar2 = (this->config).nSamples;
    if (bVar2 <= uVar10) {
      return (local_15c / (float)bVar2) * 0.9 + 0.007957749;
    }
    if (local_c0.z * local_108.z <= 0.0) {
      if (fVar8 <= 0.0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pIVar1;
        rInterface = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar6 << 0x40);
        local_e8.bottom = (IdealDiffuseBxDF *)0x0;
        local_e8.top = &this->top;
      }
      else {
        rInterface.bottom = (IdealDiffuseBxDF *)0x0;
        rInterface.top = &this->top;
        local_e8.bottom = pIVar1;
        local_e8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)
                        ->top;
      }
      fVar12 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar13 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      local_f8._0_4_ = fVar13;
      u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.x = (float)local_f8._0_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                (&wos,&rInterface,(Vector3f *)&local_c0,fVar12,&u,mode,All);
      if (0.0 < wos.pdf) {
        if (((wos.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
            (NAN(wos.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
           (((undefined1)wos.flags & Reflection) == Unset)) {
          fVar12 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          fVar13 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          local_f8._0_4_ = fVar13;
          u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          u.super_Tuple2<pbrt::Point2,_float>.x = (float)local_f8._0_4_;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    (&wis,&local_e8,(Vector3f *)&local_108,fVar12,&u,(uint)(mode == Radiance),All);
          if (((0.0 < wis.pdf) &&
              ((wis.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(wis.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
             (((undefined1)wis.flags & Reflection) == Unset)) {
            BVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                              (&rInterface);
            if ((BVar9 & Specular) == Unset) {
              BVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                (&local_e8);
              if ((BVar9 & Specular) == Unset) {
                auVar16._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar16._8_4_ = 0x80000000;
                auVar16._12_4_ = 0x80000000;
                local_128.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_128._0_8_ = vmovlps_avx(auVar16);
                FVar14 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                   (&rInterface,(Vector3f *)&local_c0,(Vector3f *)&local_128,mode,
                                    All);
                auVar17._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar17._8_4_ = 0x80000000;
                auVar17._12_4_ = 0x80000000;
                local_d0.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_d0._0_8_ = vmovlps_avx(auVar17);
                FVar15 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                   (&local_e8,(Vector3f *)&local_d0,(Vector3f *)&local_108,mode,All)
                ;
                fVar12 = (FVar15 + FVar14) * 0.5;
              }
              else {
                auVar19._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar19._8_4_ = 0x80000000;
                auVar19._12_4_ = 0x80000000;
                local_128.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_128._0_8_ = vmovlps_avx(auVar19);
                fVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                   (&rInterface,(Vector3f *)&local_c0,(Vector3f *)&local_128,mode,
                                    All);
              }
            }
            else {
              auVar18._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar18._8_4_ = 0x80000000;
              auVar18._12_4_ = 0x80000000;
              local_128.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              local_128._0_8_ = vmovlps_avx(auVar18);
              fVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                 (&local_e8,(Vector3f *)&local_128,(Vector3f *)&local_108,mode,All);
            }
            goto LAB_0039c9f2;
          }
        }
      }
    }
    else {
      local_e8.bottom = SUB168(ZEXT816(0),4);
      if (fVar8 <= 0.0) {
        rInterface.bottom = (IdealDiffuseBxDF *)0x0;
        rInterface.top = &this->top;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pIVar1;
        local_e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                   (auVar7 << 0x40);
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pIVar1;
        rInterface = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar5 << 0x40);
        local_e8.top = &this->top;
      }
      fVar12 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar13 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      local_f8._0_4_ = fVar13;
      u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.x = (float)local_f8._0_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                (&wos,&local_e8,(Vector3f *)&local_c0,fVar12,&u,mode,All);
      if (((wos.pdf <= 0.0) ||
          ((wos.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
           (!NAN(wos.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
         (((undefined1)wos.flags & Reflection) != Unset)) {
        this_01 = &local_e8;
        wi_00 = &local_108;
        wo_00 = &local_c0;
      }
      else {
        fVar12 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        fVar13 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        local_f8._0_4_ = fVar13;
        u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        u.super_Tuple2<pbrt::Point2,_float>.x = (float)local_f8._0_4_;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  (&wis,&local_e8,(Vector3f *)&local_108,fVar12,&u,(uint)(mode == Radiance),All);
        if ((wis.pdf <= 0.0) ||
           (((wis.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(wis.wi.super_Tuple3<pbrt::Vector3,_float>.z))) ||
            (((undefined1)wis.flags & Reflection) != Unset)))) goto LAB_0039cc6d;
        this_01 = &rInterface;
        wi_00 = &local_d0;
        auVar22._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar22._8_4_ = 0x80000000;
        auVar22._12_4_ = 0x80000000;
        local_128.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_d0.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_128._0_8_ = vmovlps_avx(auVar22);
        auVar23._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar23._8_4_ = 0x80000000;
        auVar23._12_4_ = 0x80000000;
        local_d0._0_8_ = vmovlps_avx(auVar23);
        wo_00 = &local_128;
      }
      fVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                         (this_01,(Vector3f *)wo_00,(Vector3f *)wi_00,mode,All);
LAB_0039c9f2:
      local_15c = local_15c + fVar12;
    }
LAB_0039cc6d:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }